

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O0

bool IsDeepThoughtDisk(Disk *disk,Sector **sector)

{
  Sector **this;
  bool bVar1;
  int iVar2;
  Header local_40;
  Header local_30;
  Sector **local_20;
  Sector **sector_local;
  Disk *disk_local;
  
  local_20 = sector;
  sector_local = (Sector **)disk;
  iVar2 = SizeToCode(0x1000);
  Header::Header(&local_30,0,0,0,iVar2);
  bVar1 = Disk::find(disk,&local_30,local_20);
  this = sector_local;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    iVar2 = SizeToCode(0x1000);
    Header::Header(&local_40,1,0,0,iVar2);
    bVar1 = Disk::find((Disk *)this,&local_40,local_20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool IsDeepThoughtDisk(Disk& disk, const Sector*& sector)
{
    // Try the primary catalogue location on cyl 0
    if (!disk.find(Header(0, 0, 0, SizeToCode(4096)), sector))
    {
        // Try the backup location on cyl 1
        if (!disk.find(Header(1, 0, 0, SizeToCode(4096)), sector))
            return false;
    }

    return true;
}